

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

fdb_status
fdb_log_impl(err_log_callback *log_callback,fdb_log_levels given_log_level,fdb_status status,
            char *source_file,char *func_name,size_t line_number,char *format,...)

{
  char in_AL;
  fdb_log_callback_ex p_Var1;
  void *pvVar2;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char log_abbr [7] [8];
  va_list args;
  char ISO_time_buffer [64];
  undefined1 local_10e8 [48];
  undefined4 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  char msg [4096];
  
  if (in_AL != '\0') {
    local_10b8 = in_XMM0_Da;
    local_10a8 = in_XMM1_Qa;
    local_1098 = in_XMM2_Qa;
    local_1088 = in_XMM3_Qa;
    local_1078 = in_XMM4_Qa;
    local_1068 = in_XMM5_Qa;
    local_1058 = in_XMM6_Qa;
    local_1048 = in_XMM7_Qa;
  }
  if (global_log_config.log_msg_level < given_log_level) {
    return status;
  }
  args[0].reg_save_area = local_10e8;
  args[0].overflow_arg_area = &stack0x00000010;
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  vsnprintf(msg,0xfff,format,args);
  if (log_callback != (err_log_callback *)0x0) {
    if (log_callback->callback_ex != (fdb_log_callback_ex)0x0) {
      p_Var1 = log_callback->callback_ex;
      pvVar2 = log_callback->ctx_data;
      goto LAB_0013040d;
    }
    if (log_callback->callback != (fdb_log_callback)0x0) {
      (*log_callback->callback)(status,msg,log_callback->ctx_data);
      return status;
    }
  }
  p_Var1 = global_log_cb.callback_ex;
  pvVar2 = global_log_cb.ctx_data;
  if (global_log_cb.callback_ex == (fdb_log_callback_ex)0x0) {
    builtin_strncpy(log_abbr[4],"INFO",5);
    log_abbr[4][5] = '\0';
    log_abbr[4][6] = '\0';
    log_abbr[4][7] = '\0';
    builtin_strncpy(log_abbr[5],"DEBG",5);
    log_abbr[5][5] = '\0';
    log_abbr[5][6] = '\0';
    log_abbr[5][7] = '\0';
    builtin_strncpy(log_abbr[2],"ERRO",5);
    log_abbr[2][5] = '\0';
    log_abbr[2][6] = '\0';
    log_abbr[2][7] = '\0';
    builtin_strncpy(log_abbr[3],"WARN",5);
    log_abbr[3][5] = '\0';
    log_abbr[3][6] = '\0';
    log_abbr[3][7] = '\0';
    builtin_strncpy(log_abbr[0],"XXXX",5);
    log_abbr[0][5] = '\0';
    log_abbr[0][6] = '\0';
    log_abbr[0][7] = '\0';
    builtin_strncpy(log_abbr[1],"FATL",5);
    log_abbr[1][5] = '\0';
    log_abbr[1][6] = '\0';
    log_abbr[1][7] = '\0';
    builtin_strncpy(log_abbr[6],"TRAC",5);
    log_abbr[6][5] = '\0';
    log_abbr[6][6] = '\0';
    log_abbr[6][7] = '\0';
    printISOTime(ISO_time_buffer,0x40);
    fprintf(_stderr,"%s [%s][FDB] %s\n",ISO_time_buffer,log_abbr + given_log_level,msg);
    return status;
  }
LAB_0013040d:
  (*p_Var1)((int)given_log_level,status,source_file,func_name,line_number,msg,pvVar2);
  return status;
}

Assistant:

fdb_status fdb_log_impl(err_log_callback* log_callback,
                        fdb_log_levels given_log_level,
                        fdb_status status,
                        const char* source_file,
                        const char* func_name,
                        size_t line_number,
                        const char *format, ...)
{
    // 1: Fatal   [FATL]
    // 2: Error   [ERRO]
    // 3: Warning [WARN]
    // 4: Info    [INFO]
    // 5: Debug   [DEBG]
    // 6: Trace   [TRAC]
    size_t cur_log_level = given_log_level;

    if (global_log_config.log_msg_level < cur_log_level) {
        // Configuration doesn't allow to print out
        // log message of this level.
        return status;
    }

    char msg[4096];
    va_list args;
    va_start(args, format);
    vsnprintf(msg, 4095, format, args);
    va_end(args);

    if (log_callback && log_callback->callback_ex) {
        // If extended callback exist, use it.
        log_callback->callback_ex
        ( cur_log_level, status, source_file, func_name, line_number,
          msg, log_callback->ctx_data );
        return status;

    } else if (log_callback && log_callback->callback) {
        // Normal callback.
        log_callback->callback(status, msg, log_callback->ctx_data);
        return status;

    } else if (global_log_cb.callback_ex) {
        // Global log callback is given.
        global_log_cb.callback_ex
        ( cur_log_level, status, source_file, func_name, line_number,
          msg, global_log_cb.ctx_data );
        return status;
    }

    // Callback is not given.
    char ISO_time_buffer[64];
    char log_abbr[7][8] = {"XXXX", "FATL", "ERRO", "WARN",
                           "INFO", "DEBG", "TRAC"};
    printISOTime(ISO_time_buffer, 64);
    if (status != FDB_RESULT_SUCCESS) {
        fprintf(stderr, "%s [%s][FDB] %s\n",
                ISO_time_buffer, log_abbr[cur_log_level], msg);
    } else {
        fprintf(stderr, "%s [%s][FDB] %s\n",
                ISO_time_buffer, log_abbr[cur_log_level], msg);
    }
    return status;
}